

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msgpuck.cc
# Opt level: O0

int test_format(void)

{
  _Bool _Var1;
  bool bVar2;
  mp_type mVar3;
  int iVar4;
  uint32_t uVar5;
  uint64_t uVar6;
  int64_t iVar7;
  char *pcVar8;
  ulong uVar9;
  float a;
  double a_00;
  ulong uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  undefined8 in_stack_fffffffffffffaa0;
  undefined4 uVar17;
  undefined8 in_stack_fffffffffffffaa8;
  undefined4 uVar18;
  undefined8 in_stack_fffffffffffffab8;
  undefined4 uVar19;
  undefined8 in_stack_fffffffffffffac0;
  undefined4 uVar21;
  undefined8 uVar20;
  bool local_512;
  bool local_511;
  ulong local_508;
  size_t z;
  bool all_zero;
  size_t test_sz;
  size_t lim;
  size_t data2_len;
  char *data2_end;
  char data2 [32];
  size_t data1_len;
  char *data1_end;
  char data1 [32];
  uint64_t expects [5];
  uint local_458;
  int i_1;
  uint i;
  uint32_t len;
  char *e;
  char *c;
  char *p;
  char *fmt;
  size_t sz;
  char buf [1024];
  size_t buf_size;
  
  uVar21 = (undefined4)((ulong)in_stack_fffffffffffffac0 >> 0x20);
  uVar19 = (undefined4)((ulong)in_stack_fffffffffffffab8 >> 0x20);
  uVar18 = (undefined4)((ulong)in_stack_fffffffffffffaa8 >> 0x20);
  uVar17 = (undefined4)((ulong)in_stack_fffffffffffffaa0 >> 0x20);
  _plan(0x11a,true);
  _space(_stdout);
  printf("# *** %s ***\n","test_format");
  buf[0x3f8] = '\0';
  buf[0x3f9] = '\x04';
  buf[0x3fa] = '\0';
  buf[0x3fb] = '\0';
  buf[0x3fc] = '\0';
  buf[0x3fd] = '\0';
  buf[0x3fe] = '\0';
  buf[0x3ff] = '\0';
  i_1 = 0;
  p = "%d %u %i  %ld %lu %li  %lld %llu %lli%hd %hu %hi  %hhd %hhu %hhi";
  uVar12 = CONCAT44(uVar17,0xb);
  uVar14 = CONCAT44(uVar18,0xc);
  uVar16 = CONCAT44(uVar19,0xe);
  uVar20 = CONCAT44(uVar21,0xf);
  fmt = (char *)mp_format((char *)&sz,0x400,
                          "%d %u %i  %ld %lu %li  %lld %llu %lli%hd %hu %hi  %hhd %hhu %hhi",1,2,3,4
                          ,5,6,7,8,9,10,uVar12,uVar14,0xd,uVar16,uVar20);
  c = (char *)&sz;
  for (local_458 = 0; local_458 < 0xf; local_458 = local_458 + 1) {
    mVar3 = mp_typeof(*c);
    _ok((uint)(mVar3 == MP_UINT),"mp_typeof(*p) == MP_UINT",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x3b7,"Test type on step %d",(ulong)local_458);
    uVar6 = mp_decode_uint(&c);
    _ok((uint)(uVar6 == local_458 + 1),"mp_decode_uint(&p) == i + 1",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x3b8,"Test value on step %d",(ulong)local_458);
  }
  uVar10 = 0xfffffffffffffffc;
  uVar11 = 0xfffffffffffffffb;
  uVar13 = 0xfffffffffffffffa;
  uVar15 = 0xfffffffffffffff8;
  fmt = (char *)mp_format((char *)&sz,0x400,p,0xffffffff,0xfffffffe,0xfffffffd,0xfffffffffffffffc,
                          0xfffffffffffffffb,0xfffffffffffffffa,0xfffffffffffffff9,
                          0xfffffffffffffff8,0xfffffffffffffff7,0xfffffff6,
                          CONCAT44((int)((ulong)uVar12 >> 0x20),0xfff5),
                          CONCAT44((int)((ulong)uVar14 >> 0x20),0xfffffff4),0xfffffff3,
                          CONCAT44((int)((ulong)uVar16 >> 0x20),0xf2),
                          CONCAT44((int)((ulong)uVar20 >> 0x20),0xfffffff1));
  c = (char *)&sz;
  for (expects[4]._4_4_ = 0; uVar19 = (undefined4)((ulong)uVar15 >> 0x20),
      uVar18 = (undefined4)((ulong)uVar13 >> 0x20), uVar17 = (undefined4)((ulong)uVar11 >> 0x20),
      (int)expects[4]._4_4_ < 0xf; expects[4]._4_4_ = expects[4]._4_4_ + 1) {
    memset(data1 + 0x18,0,0x28);
    data1[0x18] = -2;
    data1[0x19] = -1;
    data1[0x1a] = -1;
    data1[0x1b] = -1;
    data1[0x1c] = '\0';
    data1[0x1d] = '\0';
    data1[0x1e] = '\0';
    data1[0x1f] = '\0';
    if ((int)expects[4]._4_4_ % 3 == 1) {
      mVar3 = mp_typeof(*c);
      _ok((uint)(mVar3 == MP_UINT),"mp_typeof(*p) == MP_UINT",
          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
          0x3c7,"Test type on step %d",(ulong)expects[4]._4_4_);
      uVar6 = mp_decode_uint(&c);
      _ok((uint)(uVar6 == expects[(long)((int)expects[4]._4_4_ / 3) + -1]),
          "mp_decode_uint(&p) == expects[i / 3]",
          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
          0x3c9,"Test value on step %d",(ulong)expects[4]._4_4_);
    }
    else {
      mVar3 = mp_typeof(*c);
      _ok((uint)(mVar3 == MP_INT),"mp_typeof(*p) == MP_INT",
          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
          0x3cb,"Test type on step %d",(ulong)expects[4]._4_4_);
      iVar7 = mp_decode_int(&c);
      _ok((uint)(iVar7 == (int)(-1 - expects[4]._4_4_)),"mp_decode_int(&p) == - i - 1",
          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
          0x3cd,"Test value on step %d",(ulong)expects[4]._4_4_);
    }
  }
  pcVar8 = mp_encode_array((char *)&data1_end,2);
  pcVar8 = mp_encode_str(pcVar8,"ABC",3);
  pcVar8 = mp_encode_uint(pcVar8,0xb);
  data2._24_8_ = (long)pcVar8 - (long)&data1_end;
  if ((ulong)data2._24_8_ < 0x21) {
    pcVar8 = mp_encode_int((char *)&data2_end,-0x499602d2);
    pcVar8 = mp_encode_str(pcVar8,"DEFGHIJKLMN",0xb);
    pcVar8 = mp_encode_uint(pcVar8,0x141);
    uVar9 = (long)pcVar8 - (long)&data2_end;
    if (uVar9 < 0x21) {
      p = 
      "%d NIL [%d %b %b] this is test[%d %%%% [[ %d {%s %f %%  %.*s %lf %.*s NIL}%p %d %.*p ]] %d%d%d]"
      ;
      uVar10 = uVar10 & 0xffffffff00000000;
      uVar12 = CONCAT44(uVar17,0xffffffff);
      uVar14 = CONCAT44(uVar18,2);
      uVar16 = CONCAT44(uVar19,6);
      fmt = (char *)mp_format((char *)&sz,0x400,
                              "%d NIL [%d %b %b] this is test[%d %%%% [[ %d {%s %f %%  %.*s %lf %.*s NIL}%p %d %.*p ]] %d%d%d]"
                              ,0x3fb999999999999a,0x3fc999999999999a,0,1,1,uVar10,uVar12,uVar14,
                              "flt",uVar16,"double#ignored",0,"ignore",&data1_end,3,uVar9,&data2_end
                              ,4,5,6);
      e = (char *)&sz;
      _i = (char *)((long)&sz + (long)fmt);
      c = e;
      iVar4 = mp_check(&e,_i);
      _ok((uint)(iVar4 == 0),"mp_check(&c, e) == 0",
          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
          0x3ec,"check");
      mVar3 = mp_typeof(*c);
      _ok((uint)(mVar3 == MP_UINT),"mp_typeof(*p) == MP_UINT",
          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
          0x3ed,"type");
      uVar6 = mp_decode_uint(&c);
      _ok((uint)(uVar6 == 0),"mp_decode_uint(&p) == 0",
          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
          0x3ee,"decode");
      e = c;
      iVar4 = mp_check(&e,_i);
      _ok((uint)(iVar4 == 0),"mp_check(&c, e) == 0",
          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
          0x3f1,"check");
      mVar3 = mp_typeof(*c);
      _ok((uint)(mVar3 == MP_NIL),"mp_typeof(*p) == MP_NIL",
          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
          0x3f2,"type");
      mp_decode_nil(&c);
      e = c;
      iVar4 = mp_check(&e,_i);
      _ok((uint)(iVar4 == 0),"mp_check(&c, e) == 0",
          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
          0x3f6,"check");
      mVar3 = mp_typeof(*c);
      _ok((uint)(mVar3 == MP_ARRAY),"mp_typeof(*p) == MP_ARRAY",
          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
          0x3f7,"type");
      uVar5 = mp_decode_array(&c);
      _ok((uint)(uVar5 == 3),"mp_decode_array(&p) == 3",
          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
          0x3f8,"decode");
      e = c;
      iVar4 = mp_check(&e,_i);
      _ok((uint)(iVar4 == 0),"mp_check(&c, e) == 0",
          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
          0x3fb,"check");
      mVar3 = mp_typeof(*c);
      _ok((uint)(mVar3 == MP_UINT),"mp_typeof(*p) == MP_UINT",
          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
          0x3fc,"type");
      uVar6 = mp_decode_uint(&c);
      _ok((uint)(uVar6 == 1),"mp_decode_uint(&p) == 1",
          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
          0x3fd,"decode");
      e = c;
      iVar4 = mp_check(&e,_i);
      _ok((uint)(iVar4 == 0),"mp_check(&c, e) == 0",
          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
          0x400,"check");
      mVar3 = mp_typeof(*c);
      _ok((uint)(mVar3 == MP_BOOL),"mp_typeof(*p) == MP_BOOL",
          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
          0x401,"type");
      _Var1 = mp_decode_bool(&c);
      _ok((uint)_Var1,"mp_decode_bool(&p) == true",
          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
          0x402,"decode");
      e = c;
      iVar4 = mp_check(&e,_i);
      _ok((uint)(iVar4 == 0),"mp_check(&c, e) == 0",
          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
          0x405,"check");
      mVar3 = mp_typeof(*c);
      _ok((uint)(mVar3 == MP_BOOL),"mp_typeof(*p) == MP_BOOL",
          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
          0x406,"type");
      _Var1 = mp_decode_bool(&c);
      _ok((uint)!_Var1,"mp_decode_bool(&p) == false",
          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
          0x407,"decode");
      e = c;
      iVar4 = mp_check(&e,_i);
      _ok((uint)(iVar4 == 0),"mp_check(&c, e) == 0",
          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
          0x40a,"check");
      mVar3 = mp_typeof(*c);
      _ok((uint)(mVar3 == MP_ARRAY),"mp_typeof(*p) == MP_ARRAY",
          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
          0x40b,"type");
      uVar5 = mp_decode_array(&c);
      _ok((uint)(uVar5 == 5),"mp_decode_array(&p) == 5",
          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
          0x40c,"decode");
      e = c;
      iVar4 = mp_check(&e,_i);
      _ok((uint)(iVar4 == 0),"mp_check(&c, e) == 0",
          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
          0x40f,"check");
      mVar3 = mp_typeof(*c);
      _ok((uint)(mVar3 == MP_INT),"mp_typeof(*p) == MP_INT",
          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
          0x410,"type");
      iVar7 = mp_decode_int(&c);
      _ok((uint)(iVar7 == -1),"mp_decode_int(&p) == -1",
          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
          0x411,"decode");
      e = c;
      iVar4 = mp_check(&e,_i);
      _ok((uint)(iVar4 == 0),"mp_check(&c, e) == 0",
          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
          0x414,"check");
      mVar3 = mp_typeof(*c);
      _ok((uint)(mVar3 == MP_ARRAY),"mp_typeof(*p) == MP_ARRAY",
          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
          0x415,"type");
      uVar5 = mp_decode_array(&c);
      _ok((uint)(uVar5 == 1),"mp_decode_array(&p) == 1",
          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
          0x416,"decode");
      e = c;
      iVar4 = mp_check(&e,_i);
      _ok((uint)(iVar4 == 0),"mp_check(&c, e) == 0",
          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
          0x419,"check");
      mVar3 = mp_typeof(*c);
      _ok((uint)(mVar3 == MP_ARRAY),"mp_typeof(*p) == MP_ARRAY",
          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
          0x41a,"type");
      uVar5 = mp_decode_array(&c);
      _ok((uint)(uVar5 == 5),"mp_decode_array(&p) == 5",
          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
          0x41b,"decode");
      e = c;
      iVar4 = mp_check(&e,_i);
      _ok((uint)(iVar4 == 0),"mp_check(&c, e) == 0",
          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
          0x41e,"check");
      mVar3 = mp_typeof(*c);
      _ok((uint)(mVar3 == MP_UINT),"mp_typeof(*p) == MP_UINT",
          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
          0x41f,"type");
      uVar6 = mp_decode_uint(&c);
      _ok((uint)(uVar6 == 2),"mp_decode_uint(&p) == 2",
          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
          0x420,"decode");
      e = c;
      iVar4 = mp_check(&e,_i);
      _ok((uint)(iVar4 == 0),"mp_check(&c, e) == 0",
          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
          0x423,"check");
      mVar3 = mp_typeof(*c);
      _ok((uint)(mVar3 == MP_MAP),"mp_typeof(*p) == MP_MAP",
          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
          0x424,"type");
      uVar5 = mp_decode_map(&c);
      _ok((uint)(uVar5 == 3),"mp_decode_map(&p) == 3",
          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
          0x425,"decode");
      e = c;
      iVar4 = mp_check(&e,_i);
      _ok((uint)(iVar4 == 0),"mp_check(&c, e) == 0",
          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
          0x428,"check");
      mVar3 = mp_typeof(*c);
      _ok((uint)(mVar3 == MP_STR),"mp_typeof(*p) == MP_STR",
          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
          0x429,"type");
      e = mp_decode_str(&c,(uint32_t *)&i_1);
      _ok((uint)(i_1 == 3),"len == 3",
          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
          0x42b,"decode");
      iVar4 = memcmp(e,"flt",3);
      _ok((uint)(iVar4 == 0),"memcmp(c, \"flt\", 3) == 0",
          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
          0x42c,"compare");
      e = c;
      iVar4 = mp_check(&e,_i);
      _ok((uint)(iVar4 == 0),"mp_check(&c, e) == 0",
          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
          0x42f,"check");
      mVar3 = mp_typeof(*c);
      _ok((uint)(mVar3 == MP_FLOAT),"mp_typeof(*p) == MP_FLOAT",
          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
          0x430,"type");
      a = mp_decode_float(&c);
      bVar2 = fequal(a,0.1);
      _ok((uint)bVar2,"fequal(mp_decode_float(&p), 0.1)",
          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
          0x431,"decode");
      e = c;
      iVar4 = mp_check(&e,_i);
      _ok((uint)(iVar4 == 0),"mp_check(&c, e) == 0",
          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
          0x434,"check");
      mVar3 = mp_typeof(*c);
      _ok((uint)(mVar3 == MP_STR),"mp_typeof(*p) == MP_STR",
          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
          0x435,"type");
      e = mp_decode_str(&c,(uint32_t *)&i_1);
      _ok((uint)(i_1 == 6),"len == 6",
          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
          0x437,"decode");
      iVar4 = memcmp(e,"double",6);
      _ok((uint)(iVar4 == 0),"memcmp(c, \"double\", 6) == 0",
          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
          0x438,"compare");
      e = c;
      iVar4 = mp_check(&e,_i);
      _ok((uint)(iVar4 == 0),"mp_check(&c, e) == 0",
          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
          0x43b,"check");
      mVar3 = mp_typeof(*c);
      _ok((uint)(mVar3 == MP_DOUBLE),"mp_typeof(*p) == MP_DOUBLE",
          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
          0x43c,"type");
      a_00 = mp_decode_double(&c);
      bVar2 = dequal(a_00,0.2);
      _ok((uint)bVar2,"dequal(mp_decode_double(&p), 0.2)",
          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
          0x43d,"decode");
      e = c;
      iVar4 = mp_check(&e,_i);
      _ok((uint)(iVar4 == 0),"mp_check(&c, e) == 0",
          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
          0x440,"check");
      mVar3 = mp_typeof(*c);
      _ok((uint)(mVar3 == MP_STR),"mp_typeof(*p) == MP_STR",
          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
          0x441,"type");
      e = mp_decode_str(&c,(uint32_t *)&i_1);
      _ok((uint)(i_1 == 0),"len == 0",
          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
          0x443,"decode");
      e = c;
      iVar4 = mp_check(&e,_i);
      _ok((uint)(iVar4 == 0),"mp_check(&c, e) == 0",
          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
          0x446,"check");
      mVar3 = mp_typeof(*c);
      _ok((uint)(mVar3 == MP_NIL),"mp_typeof(*p) == MP_NIL",
          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
          0x447,"type");
      mp_decode_nil(&c);
      e = c;
      iVar4 = mp_check(&e,_i);
      _ok((uint)(iVar4 == 0),"mp_check(&c, e) == 0",
          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
          1099,"check");
      local_511 = false;
      if ((long)e - (long)c == data2._24_8_) {
        iVar4 = memcmp(c,&data1_end,data2._24_8_);
        local_511 = iVar4 == 0;
      }
      _ok((uint)local_511,"((size_t)(c - p) == data1_len) && memcmp(p, data1, data1_len) == 0",
          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
          0x44d,"compare");
      c = e;
      iVar4 = mp_check(&e,_i);
      _ok((uint)(iVar4 == 0),"mp_check(&c, e) == 0",
          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
          0x451,"check");
      mVar3 = mp_typeof(*c);
      _ok((uint)(mVar3 == MP_UINT),"mp_typeof(*p) == MP_UINT",
          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
          0x452,"type");
      uVar6 = mp_decode_uint(&c);
      _ok((uint)(uVar6 == 3),"mp_decode_uint(&p) == 3",
          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
          0x453,"decode");
      e = c;
      iVar4 = mp_check(&e,_i);
      _ok((uint)(iVar4 == 0),"mp_check(&c, e) == 0",
          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
          0x456,"check");
      mVar3 = mp_typeof(*c);
      _ok((uint)(mVar3 == MP_INT),"mp_typeof(*p) == MP_INT",
          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
          0x457,"type");
      iVar7 = mp_decode_int(&c);
      _ok((uint)(iVar7 == -0x499602d2),"mp_decode_int(&p) == -1234567890",
          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
          0x458,"decode");
      e = c;
      iVar4 = mp_check(&e,_i);
      _ok((uint)(iVar4 == 0),"mp_check(&c, e) == 0",
          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
          0x45b,"check");
      mVar3 = mp_typeof(*c);
      _ok((uint)(mVar3 == MP_STR),"mp_typeof(*p) == MP_STR",
          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
          0x45c,"type");
      e = mp_decode_str(&c,(uint32_t *)&i_1);
      _ok((uint)(i_1 == 0xb),"len == 11",
          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
          0x45e,"decode");
      iVar4 = memcmp(e,"DEFGHIJKLMN",0xb);
      _ok((uint)(iVar4 == 0),"memcmp(c, \"DEFGHIJKLMN\", 11) == 0",
          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
          0x45f,"compare");
      e = c;
      iVar4 = mp_check(&e,_i);
      _ok((uint)(iVar4 == 0),"mp_check(&c, e) == 0",
          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
          0x462,"check");
      mVar3 = mp_typeof(*c);
      _ok((uint)(mVar3 == MP_UINT),"mp_typeof(*p) == MP_UINT",
          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
          0x463,"type");
      uVar6 = mp_decode_uint(&c);
      _ok((uint)(uVar6 == 0x141),"mp_decode_uint(&p) == 321",
          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
          0x464,"decode");
      e = c;
      iVar4 = mp_check(&e,_i);
      _ok((uint)(iVar4 == 0),"mp_check(&c, e) == 0",
          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
          0x467,"check");
      mVar3 = mp_typeof(*c);
      _ok((uint)(mVar3 == MP_UINT),"mp_typeof(*p) == MP_UINT",
          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
          0x468,"type");
      uVar6 = mp_decode_uint(&c);
      _ok((uint)(uVar6 == 4),"mp_decode_uint(&p) == 4",
          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
          0x469,"decode");
      e = c;
      iVar4 = mp_check(&e,_i);
      _ok((uint)(iVar4 == 0),"mp_check(&c, e) == 0",
          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
          0x46c,"check");
      mVar3 = mp_typeof(*c);
      _ok((uint)(mVar3 == MP_UINT),"mp_typeof(*p) == MP_UINT",
          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
          0x46d,"type");
      uVar6 = mp_decode_uint(&c);
      _ok((uint)(uVar6 == 5),"mp_decode_uint(&p) == 5",
          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
          0x46e,"decode");
      e = c;
      iVar4 = mp_check(&e,_i);
      _ok((uint)(iVar4 == 0),"mp_check(&c, e) == 0",
          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
          0x471,"check");
      mVar3 = mp_typeof(*c);
      _ok((uint)(mVar3 == MP_UINT),"mp_typeof(*p) == MP_UINT",
          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
          0x472,"type");
      uVar6 = mp_decode_uint(&c);
      _ok((uint)(uVar6 == 6),"mp_decode_uint(&p) == 6",
          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
          0x473,"decode");
      _ok((uint)(c == _i),"p == e",
          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
          0x475,"nothing more");
      _ok((uint)(fmt < (char *)0x46),"sz < 70",
          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
          0x477,"no magic detected");
      for (test_sz = 0; uVar19 = (undefined4)((ulong)uVar16 >> 0x20),
          uVar18 = (undefined4)((ulong)uVar14 >> 0x20), uVar17 = (undefined4)((ulong)uVar12 >> 0x20)
          , test_sz < 0x47; test_sz = test_sz + 1) {
        memset(&sz,0,0x400);
        uVar10 = uVar10 & 0xffffffff00000000;
        uVar12 = CONCAT44(uVar17,0xffffffff);
        uVar14 = CONCAT44(uVar18,2);
        uVar16 = CONCAT44(uVar19,6);
        pcVar8 = (char *)mp_format((char *)&sz,test_sz,p,0x3fb999999999999a,0x3fc999999999999a,0,1,1
                                   ,uVar10,uVar12,uVar14,"flt",uVar16,"double#ignored",0,"ignore",
                                   &data1_end,3,uVar9,&data2_end,4,5,6);
        _ok((uint)(pcVar8 == fmt),"test_sz == sz",
            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
            0x47c,"return value on step %d",test_sz & 0xffffffff);
        z._7_1_ = true;
        for (local_508 = test_sz; local_508 < 0x400; local_508 = local_508 + 1) {
          local_512 = false;
          if (z._7_1_ != false) {
            local_512 = buf[local_508 - 8] == '\0';
          }
          z._7_1_ = local_512;
        }
        _ok((uint)z._7_1_,"all_zero",
            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
            0x480,"buffer overflow on step %d",test_sz & 0xffffffff);
      }
      _space(_stdout);
      printf("# *** %s: done ***\n","test_format");
      iVar4 = check_plan();
      return iVar4;
    }
    __assert_fail("data2_len <= sizeof(data2)",
                  "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                  ,0x3df,"int test_format()");
  }
  __assert_fail("data1_len <= sizeof(data1)",
                "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                ,0x3d7,"int test_format()");
}

Assistant:

static int
test_format(void)
{
	plan(282);
	header();

	const size_t buf_size = 1024;
	char buf[buf_size];
	size_t sz;
	const char *fmt;
	const char *p, *c, *e;
	uint32_t len = 0;

	fmt = "%d %u %i  %ld %lu %li  %lld %llu %lli"
	      "%hd %hu %hi  %hhd %hhu %hhi";
	sz = mp_format(buf, buf_size, fmt, 1, 2, 3,
		       (long)4, (long)5, (long)6,
		       (long long)7, (long long)8, (long long)9,
		       (short)10, (short)11, (short)12,
		       (char)13, (char)14, (char)15);
	p = buf;
	for (unsigned i = 0; i < 15; i++) {
		ok(mp_typeof(*p) == MP_UINT, "Test type on step %d", i);
		ok(mp_decode_uint(&p) == i + 1, "Test value on step %d", i);
	}
	sz = mp_format(buf, buf_size, fmt, -1, -2, -3,
		       (long)-4, (long)-5, (long)-6,
		       (long long)-7, (long long)-8, (long long)-9,
		       (short)-10, (unsigned short)-11, (short)-12,
		       (signed char)-13, (unsigned char)-14, (signed char)-15);
	p = buf;
	for (int i = 0; i < 15; i++) {
		uint64_t expects[5] = { UINT_MAX - 1,
					ULONG_MAX - 4,
					ULLONG_MAX - 7,
					USHRT_MAX - 10,
					UCHAR_MAX - 13 };
		if (i % 3 == 1) {
			ok(mp_typeof(*p) == MP_UINT, "Test type on step %d", i);
			ok(mp_decode_uint(&p) == expects[i / 3],
			   "Test value on step %d", i);
		} else {
			ok(mp_typeof(*p) == MP_INT, "Test type on step %d", i);
			ok(mp_decode_int(&p) == - i - 1,
			   "Test value on step %d", i);
		}
	}

	char data1[32];
	char *data1_end = data1;
	data1_end = mp_encode_array(data1_end, 2);
	data1_end = mp_encode_str(data1_end, "ABC", 3);
	data1_end = mp_encode_uint(data1_end, 11);
	size_t data1_len = data1_end - data1;
	assert(data1_len <= sizeof(data1));

	char data2[32];
	char *data2_end = data2;
	data2_end = mp_encode_int(data2_end, -1234567890);
	data2_end = mp_encode_str(data2_end, "DEFGHIJKLMN", 11);
	data2_end = mp_encode_uint(data2_end, 321);
	size_t data2_len = data2_end - data2;
	assert(data2_len <= sizeof(data2));

	fmt = "%d NIL [%d %b %b] this is test"
		"[%d %%%% [[ %d {%s %f %%  %.*s %lf %.*s NIL}"
		"%p %d %.*p ]] %d%d%d]";
#define TEST_PARAMS 0, 1, true, false, -1, 2, \
	"flt", 0.1, 6, "double#ignored", 0.2, 0, "ignore", \
	data1, 3, data2_len, data2, 4, 5, 6
	sz = mp_format(buf, buf_size, fmt, TEST_PARAMS);
	p = buf;
	e = buf + sz;

	c = p;
	ok(mp_check(&c, e) == 0, "check");
	ok(mp_typeof(*p) == MP_UINT, "type");
	ok(mp_decode_uint(&p) == 0, "decode");

	c = p;
	ok(mp_check(&c, e) == 0, "check");
	ok(mp_typeof(*p) == MP_NIL, "type");
	mp_decode_nil(&p);

	c = p;
	ok(mp_check(&c, e) == 0, "check");
	ok(mp_typeof(*p) == MP_ARRAY, "type");
	ok(mp_decode_array(&p) == 3, "decode");

	c = p;
	ok(mp_check(&c, e) == 0, "check");
	ok(mp_typeof(*p) == MP_UINT, "type");
	ok(mp_decode_uint(&p) == 1, "decode");

	c = p;
	ok(mp_check(&c, e) == 0, "check");
	ok(mp_typeof(*p) == MP_BOOL, "type");
	ok(mp_decode_bool(&p) == true, "decode");

	c = p;
	ok(mp_check(&c, e) == 0, "check");
	ok(mp_typeof(*p) == MP_BOOL, "type");
	ok(mp_decode_bool(&p) == false, "decode");

	c = p;
	ok(mp_check(&c, e) == 0, "check");
	ok(mp_typeof(*p) == MP_ARRAY, "type");
	ok(mp_decode_array(&p) == 5, "decode");

	c = p;
	ok(mp_check(&c, e) == 0, "check");
	ok(mp_typeof(*p) == MP_INT, "type");
	ok(mp_decode_int(&p) == -1, "decode");

	c = p;
	ok(mp_check(&c, e) == 0, "check");
	ok(mp_typeof(*p) == MP_ARRAY, "type");
	ok(mp_decode_array(&p) == 1, "decode");

	c = p;
	ok(mp_check(&c, e) == 0, "check");
	ok(mp_typeof(*p) == MP_ARRAY, "type");
	ok(mp_decode_array(&p) == 5, "decode");

	c = p;
	ok(mp_check(&c, e) == 0, "check");
	ok(mp_typeof(*p) == MP_UINT, "type");
	ok(mp_decode_uint(&p) == 2, "decode");

	c = p;
	ok(mp_check(&c, e) == 0, "check");
	ok(mp_typeof(*p) == MP_MAP, "type");
	ok(mp_decode_map(&p) == 3, "decode");

	c = p;
	ok(mp_check(&c, e) == 0, "check");
	ok(mp_typeof(*p) == MP_STR, "type");
	c = mp_decode_str(&p, &len);
	ok(len == 3, "decode");
	ok(memcmp(c, "flt", 3) == 0, "compare");

	c = p;
	ok(mp_check(&c, e) == 0, "check");
	ok(mp_typeof(*p) == MP_FLOAT, "type");
	ok(fequal(mp_decode_float(&p), 0.1), "decode");

	c = p;
	ok(mp_check(&c, e) == 0, "check");
	ok(mp_typeof(*p) == MP_STR, "type");
	c = mp_decode_str(&p, &len);
	ok(len == 6, "decode");
	ok(memcmp(c, "double", 6) == 0, "compare");

	c = p;
	ok(mp_check(&c, e) == 0, "check");
	ok(mp_typeof(*p) == MP_DOUBLE, "type");
	ok(dequal(mp_decode_double(&p), 0.2), "decode");

	c = p;
	ok(mp_check(&c, e) == 0, "check");
	ok(mp_typeof(*p) == MP_STR, "type");
	c = mp_decode_str(&p, &len);
	ok(len == 0, "decode");

	c = p;
	ok(mp_check(&c, e) == 0, "check");
	ok(mp_typeof(*p) == MP_NIL, "type");
	mp_decode_nil(&p);

	c = p;
	ok(mp_check(&c, e) == 0, "check");
	ok(((size_t)(c - p) == data1_len) &&
	   memcmp(p, data1, data1_len) == 0, "compare");
	p = c;

	c = p;
	ok(mp_check(&c, e) == 0, "check");
	ok(mp_typeof(*p) == MP_UINT, "type");
	ok(mp_decode_uint(&p) == 3, "decode");

	c = p;
	ok(mp_check(&c, e) == 0, "check");
	ok(mp_typeof(*p) == MP_INT, "type");
	ok(mp_decode_int(&p) == -1234567890, "decode");

	c = p;
	ok(mp_check(&c, e) == 0, "check");
	ok(mp_typeof(*p) == MP_STR, "type");
	c = mp_decode_str(&p, &len);
	ok(len == 11, "decode");
	ok(memcmp(c, "DEFGHIJKLMN", 11) == 0, "compare");

	c = p;
	ok(mp_check(&c, e) == 0, "check");
	ok(mp_typeof(*p) == MP_UINT, "type");
	ok(mp_decode_uint(&p) == 321, "decode");

	c = p;
	ok(mp_check(&c, e) == 0, "check");
	ok(mp_typeof(*p) == MP_UINT, "type");
	ok(mp_decode_uint(&p) == 4, "decode");

	c = p;
	ok(mp_check(&c, e) == 0, "check");
	ok(mp_typeof(*p) == MP_UINT, "type");
	ok(mp_decode_uint(&p) == 5, "decode");

	c = p;
	ok(mp_check(&c, e) == 0, "check");
	ok(mp_typeof(*p) == MP_UINT, "type");
	ok(mp_decode_uint(&p) == 6, "decode");

	ok(p == e, "nothing more");

	ok(sz < 70, "no magic detected");

	for (size_t lim = 0; lim <= 70; lim++) {
		memset(buf, 0, buf_size);
		size_t test_sz = mp_format(buf, lim, fmt, TEST_PARAMS);
		ok(test_sz == sz, "return value on step %d", (int)lim);
		bool all_zero = true;
		for(size_t z = lim; z < buf_size; z++)
			all_zero = all_zero && (buf[z] == 0);
		ok(all_zero, "buffer overflow on step %d", (int)lim);

	}

#undef TEST_PARAMS

	footer();
	return check_plan();
}